

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::flipshpush(tetgenmesh *this,face *flipedge)

{
  badface *pbVar1;
  point pdVar2;
  badface *newflipface;
  face *flipedge_local;
  tetgenmesh *this_local;
  
  pbVar1 = (badface *)memorypool::alloc(this->flippool);
  face::operator=(&pbVar1->ss,flipedge);
  pdVar2 = sorg(this,flipedge);
  pbVar1->forg = pdVar2;
  pdVar2 = sdest(this,flipedge);
  pbVar1->fdest = pdVar2;
  pbVar1->nextitem = this->flipstack;
  this->flipstack = pbVar1;
  return;
}

Assistant:

void tetgenmesh::flipshpush(face* flipedge)
{
  badface *newflipface;

  newflipface = (badface *) flippool->alloc();
  newflipface->ss = *flipedge;
  newflipface->forg = sorg(*flipedge);
  newflipface->fdest = sdest(*flipedge);
  newflipface->nextitem = flipstack;
  flipstack = newflipface;
}